

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script_tests.cpp
# Opt level: O2

void __thiscall script_tests::script_assets_test::test_method(script_assets_test *this)

{
  string strFlags;
  uint *puVar1;
  bool bVar2;
  bool bVar3;
  readonly_property<bool> rVar4;
  char *c;
  size_type __n;
  UniValue *this_00;
  UniValue *pUVar5;
  string *psVar6;
  UniValue *this_01;
  long lVar7;
  ulong index;
  uint *puVar8;
  size_t index_00;
  iterator in_R8;
  iterator pvVar9;
  iterator pvVar10;
  CachingTransactionSignatureChecker *checker;
  CachingTransactionSignatureChecker *checker_00;
  iterator in_R9;
  long in_FS_OFFSET;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  string_view jsondata;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  string_view hex_str;
  string_view hex_str_00;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  undefined4 uVar11;
  undefined4 uVar12;
  check_type cVar13;
  vector<CTxOut,_std::allocator<CTxOut>_> *this_02;
  undefined4 in_stack_fffffffffffff710;
  uint in_stack_fffffffffffff714;
  char *local_8c0;
  char *local_8b8;
  undefined1 *local_8b0;
  undefined1 *local_8a8;
  char *local_8a0;
  char *local_898;
  char *local_890;
  char *local_888;
  undefined1 *local_880;
  undefined1 *local_878;
  char *local_870;
  char *local_868;
  char *local_860;
  char *local_858;
  undefined1 *local_850;
  undefined1 *local_848;
  char *local_840;
  char *local_838;
  char *local_830;
  char *local_828;
  undefined1 *local_820;
  undefined1 *local_818;
  char *local_810;
  char *local_808;
  char *local_800;
  char *local_7f8;
  undefined1 *local_7f0;
  undefined1 *local_7e8;
  char *local_7e0;
  char *local_7d8;
  char *local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  undefined1 *local_7b0;
  undefined1 *local_7a8;
  char *local_7a0;
  char *local_798;
  char *local_790;
  char *local_788;
  lazy_ostream local_780;
  undefined1 *local_770;
  char **local_768;
  assertion_result local_760;
  undefined1 *local_748;
  undefined1 *local_740;
  char *local_738;
  char *local_730;
  char *local_728;
  char *local_720;
  undefined1 *local_718;
  undefined1 *local_710;
  char *local_708;
  char *local_700;
  vector<CTxOut,_std::allocator<CTxOut>_> prevouts;
  CMutableTransaction mtx;
  char *local_6a0;
  char *local_698;
  undefined1 *local_690;
  undefined1 *local_688;
  char *local_680;
  char *local_678;
  UniValue tests;
  string data;
  ifstream file;
  path local_3f0;
  path path;
  SignatureCache signature_cache;
  CachingTransactionSignatureChecker txcheck;
  CTxOut txout;
  vector<CTxOut,_std::allocator<CTxOut>_> local_f8;
  CTransaction tx;
  ParamsWrapper<TransactionSerParams,_CMutableTransaction> local_58 [2];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  SignatureCache::SignatureCache(&signature_cache,0x1000000);
  c = getenv("DIR_UNIT_TEST_DATA");
  local_7e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp";
  local_7d8 = "";
  local_7f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x646;
  file_00.m_begin = (iterator)&local_7e0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_7f0,msg);
  txout.nValue = CONCAT71(txout.nValue._1_7_,c != (char *)0x0);
  txout.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
  txout.scriptPubKey.super_CScriptBase._union._8_8_ = 0;
  _file = &PTR__lazy_ostream_01149250;
  local_800 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp";
  local_7f8 = "";
  pvVar10 = &DAT_00000001;
  pvVar9 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&txout,(lazy_ostream *)&file,0,1,WARN,_cVar13,(size_t)&local_800,
             0x646);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&txout.scriptPubKey.super_CScriptBase._union + 8));
  if (c != (char *)0x0) {
    fs::path::path((path *)&local_3f0,c);
    fs::path::operator/=((path *)&local_3f0,"script_assets_test.json");
    std::filesystem::__cxx11::path::path(&path.super_path,&local_3f0);
    std::filesystem::__cxx11::path::~path(&local_3f0);
    bVar2 = std::filesystem::exists(&path.super_path);
    local_810 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
    ;
    local_808 = "";
    local_820 = &boost::unit_test::basic_cstring<char_const>::null;
    local_818 = &boost::unit_test::basic_cstring<char_const>::null;
    file_01.m_end = (iterator)0x64a;
    file_01.m_begin = (iterator)&local_810;
    msg_00.m_end = pvVar10;
    msg_00.m_begin = pvVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_820,
               msg_00);
    txout.nValue = CONCAT71(txout.nValue._1_7_,bVar2);
    txout.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect = (char *)0x0;
    txout.scriptPubKey.super_CScriptBase._union._8_8_ = 0;
    _file = &PTR__lazy_ostream_0114c630;
    local_830 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
    ;
    local_828 = "";
    pvVar10 = &DAT_00000001;
    pvVar9 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&txout,(lazy_ostream *)&file,0,1,WARN,_cVar13,(size_t)&local_830,
               0x64a);
    boost::detail::shared_count::~shared_count
              ((shared_count *)((long)&txout.scriptPubKey.super_CScriptBase._union + 8));
    if (bVar2) {
      std::ifstream::ifstream(&file,path.super_path._M_pathname._M_dataplus._M_p,_S_in);
      local_840 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
      ;
      local_838 = "";
      local_850 = &boost::unit_test::basic_cstring<char_const>::null;
      local_848 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = (iterator)0x64d;
      file_02.m_begin = (iterator)&local_840;
      msg_01.m_end = pvVar10;
      msg_01.m_begin = pvVar9;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_850,
                 msg_01);
      tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start._0_1_ = std::__basic_file<char>::is_open();
      tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      txout.scriptPubKey.super_CScriptBase._union._16_8_ = &tests;
      tests._0_8_ = anon_var_dwarf_f1c00e;
      tests.val._M_dataplus._M_p = "";
      txout.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
           (char *)((ulong)txout.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect &
                   0xffffffffffffff00);
      txout.nValue = (CAmount)&PTR__lazy_ostream_011481f0;
      txout.scriptPubKey.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
      local_860 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
      ;
      local_858 = "";
      pvVar10 = &DAT_00000001;
      pvVar9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&tx,(lazy_ostream *)&txout,1,0,WARN,_cVar13,(size_t)&local_860,
                 0x64d);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      std::istream::seekg((long)&file,_S_beg);
      __n = std::istream::tellg();
      std::istream::seekg((long)&file,_S_beg);
      data._M_dataplus._M_p = (pointer)&data.field_2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                (&data,__n,'\0');
      std::istream::read((char *)&file,(long)data._M_dataplus._M_p);
      jsondata._M_str = data._M_dataplus._M_p;
      jsondata._M_len = data._M_string_length;
      read_json(&tests,jsondata);
      local_870 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
      ;
      local_868 = "";
      local_880 = &boost::unit_test::basic_cstring<char_const>::null;
      local_878 = &boost::unit_test::basic_cstring<char_const>::null;
      file_03.m_end = (iterator)0x654;
      file_03.m_begin = (iterator)&local_870;
      msg_02.m_end = pvVar9;
      msg_02.m_begin = pvVar10;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_880,
                 msg_02);
      tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start._0_1_ = tests.typ == VARR;
      tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)anon_var_dwarf_f1c01b;
      mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0xbe4252;
      txout.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
           (char *)((ulong)txout.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect &
                   0xffffffffffffff00);
      txout.nValue = (CAmount)&PTR__lazy_ostream_011481f0;
      txout.scriptPubKey.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
      local_890 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
      ;
      local_888 = "";
      pvVar10 = &DAT_00000001;
      pvVar9 = (iterator)0x0;
      txout.scriptPubKey.super_CScriptBase._union._16_8_ = &mtx;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&tx,(lazy_ostream *)&txout,1,0,WARN,_cVar13,(size_t)&local_890,
                 0x654);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      local_8a0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
      ;
      local_898 = "";
      local_8b0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_8a8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_04.m_end = (iterator)0x655;
      file_04.m_begin = (iterator)&local_8a0;
      msg_03.m_end = pvVar9;
      msg_03.m_begin = pvVar10;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_8b0,
                 msg_03);
      tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start._0_1_ =
           tests.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_finish !=
           tests.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
           super__Vector_impl_data._M_start;
      tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)anon_var_dwarf_f1c028;
      mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0xbe4263;
      txout.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
           (char *)((ulong)txout.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect &
                   0xffffffffffffff00);
      txout.nValue = (CAmount)&PTR__lazy_ostream_011481f0;
      txout.scriptPubKey.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
      local_8c0 = 
      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
      ;
      local_8b8 = "";
      checker = (CachingTransactionSignatureChecker *)&DAT_00000001;
      pvVar10 = (iterator)0x0;
      txout.scriptPubKey.super_CScriptBase._union._16_8_ = &mtx;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)&tx,(lazy_ostream *)&txout,1,0,WARN,_cVar13,(size_t)&local_8c0,
                 0x655);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      this_02 = &local_f8;
      index_00 = 0;
      while( true ) {
        if ((ulong)(((long)tests.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)tests.values.super__Vector_base<UniValue,_std::allocator<UniValue>_>.
                          _M_impl.super__Vector_impl_data._M_start) / 0x58) <= index_00) break;
        this_00 = UniValue::operator[](&tests,index_00);
        local_680 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
        ;
        local_678 = "";
        local_690 = &boost::unit_test::basic_cstring<char_const>::null;
        local_688 = &boost::unit_test::basic_cstring<char_const>::null;
        file_05.m_end = (iterator)0x612;
        file_05.m_begin = (iterator)&local_680;
        msg_04.m_end = pvVar10;
        msg_04.m_begin = (iterator)checker;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_690
                   ,msg_04);
        tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
        _M_start._0_1_ = this_00->typ == VOBJ;
        tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)anon_var_dwarf_f1d56d;
        mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0xbe4c64;
        txout.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
             (char *)((ulong)txout.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect
                     & 0xffffffffffffff00);
        txout.nValue = (CAmount)&PTR__lazy_ostream_011481f0;
        txout.scriptPubKey.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
        local_6a0 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
        ;
        local_698 = "";
        pvVar10 = &DAT_00000001;
        pvVar9 = (iterator)0x0;
        txout.scriptPubKey.super_CScriptBase._union._16_8_ = &mtx;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&tx,(lazy_ostream *)&txout,1,0,WARN,(check_type)this_00,
                   (size_t)&local_6a0,0x612);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&txout,"tx",(allocator<char> *)&local_780);
        pUVar5 = UniValue::operator[](this_00,(string *)&txout);
        psVar6 = UniValue::get_str_abi_cxx11_(pUVar5);
        CMutableTransaction::CMutableTransaction(&mtx);
        hex_str._M_str = (psVar6->_M_dataplus)._M_p;
        hex_str._M_len = psVar6->_M_string_length;
        ParseHex<unsigned_char>
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&tx,hex_str);
        txcheck.super_TransactionSignatureChecker.super_BaseSignatureChecker.
        _vptr_BaseSignatureChecker =
             (_func_int **)
             CONCAT71(tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start._1_7_,
                      tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start._0_1_);
        txcheck.super_TransactionSignatureChecker.txTo =
             (CTransaction *)
             ((long)tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)txcheck.super_TransactionSignatureChecker.super_BaseSignatureChecker.
                   _vptr_BaseSignatureChecker);
        local_58[0].m_params = &::TX_NO_WITNESS;
        local_58[0].m_object = &mtx;
        ParamsWrapper<TransactionSerParams,_CMutableTransaction>::Unserialize<SpanReader>
                  (local_58,(SpanReader *)&txcheck);
        std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                  ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&tx);
        std::__cxx11::string::~string((string *)&txout);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&tx,"prevouts",(allocator<char> *)&local_780);
        pUVar5 = UniValue::operator[](this_00,(string *)&tx);
        if (pUVar5->typ != VARR) {
          __assert_fail("univalue.isArray()",
                        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
                        ,0x5df,"std::vector<CTxOut> script_tests::TxOutsFromJSON(const UniValue &)")
          ;
        }
        prevouts.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
        ._M_start = (pointer)0x0;
        prevouts.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
        ._M_finish = (pointer)0x0;
        prevouts.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x0;
        for (index = 0;
            index < (ulong)(((long)(pUVar5->values).
                                   super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                            (long)(pUVar5->values).
                                  super__Vector_base<UniValue,_std::allocator<UniValue>_>._M_impl.
                                  super__Vector_impl_data._M_start) / 0x58); index = index + 1) {
          CTxOut::CTxOut(&txout);
          this_01 = UniValue::operator[](pUVar5,index);
          psVar6 = UniValue::get_str_abi_cxx11_(this_01);
          hex_str_00._M_str = (psVar6->_M_dataplus)._M_p;
          hex_str_00._M_len = psVar6->_M_string_length;
          ParseHex<unsigned_char>
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&txcheck,hex_str_00);
          local_58[0].m_object =
               (CMutableTransaction *)
               ((long)txcheck.super_TransactionSignatureChecker.txTo -
               (long)txcheck.super_TransactionSignatureChecker.super_BaseSignatureChecker.
                     _vptr_BaseSignatureChecker);
          local_58[0].m_params =
               (TransactionSerParams *)
               txcheck.super_TransactionSignatureChecker.super_BaseSignatureChecker.
               _vptr_BaseSignatureChecker;
          CTxOut::SerializationOps<SpanReader,CTxOut,ActionUnserialize>(&txout,local_58);
          std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                    ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&txcheck);
          std::vector<CTxOut,_std::allocator<CTxOut>_>::emplace_back<CTxOut>(&prevouts,&txout);
          prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                    (&txout.scriptPubKey.super_CScriptBase);
        }
        std::__cxx11::string::~string((string *)&tx);
        local_708 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
        ;
        local_700 = "";
        local_718 = &boost::unit_test::basic_cstring<char_const>::null;
        local_710 = &boost::unit_test::basic_cstring<char_const>::null;
        file_06.m_end = (iterator)0x616;
        file_06.m_begin = (iterator)&local_708;
        msg_05.m_end = pvVar9;
        msg_05.m_begin = pvVar10;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_718
                   ,msg_05);
        tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
        _M_start._0_1_ =
             ((long)prevouts.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)prevouts.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x28 ==
             ((long)mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_finish -
             (long)mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                   super__Vector_impl_data._M_start) / 0x68;
        tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        txcheck.super_TransactionSignatureChecker.super_BaseSignatureChecker.
        _vptr_BaseSignatureChecker = (_func_int **)anon_var_dwarf_f1d594;
        txcheck.super_TransactionSignatureChecker.txTo = (CTransaction *)0xbe4c8f;
        txout.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect =
             (char *)((ulong)txout.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect
                     & 0xffffffffffffff00);
        txout.nValue = (CAmount)&PTR__lazy_ostream_011481f0;
        txout.scriptPubKey.super_CScriptBase._union._8_8_ = boost::unit_test::lazy_ostream::inst;
        txout.scriptPubKey.super_CScriptBase._union._16_8_ = &txcheck;
        local_728 = 
        "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
        ;
        local_720 = "";
        uVar11 = 0;
        uVar12 = 0;
        checker = (CachingTransactionSignatureChecker *)&DAT_00000001;
        pvVar10 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)&tx,(lazy_ostream *)&txout,1,0,WARN,(check_type)this_00,
                   (size_t)&local_728,0x616);
        boost::detail::shared_count::~shared_count
                  ((shared_count *)
                   &tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&txout,"index",(allocator<char> *)&tx);
        pUVar5 = UniValue::operator[](this_00,(string *)&txout);
        lVar7 = UniValue::getInt<long>(pUVar5);
        std::__cxx11::string::~string((string *)&txout);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&txout,"flags",(allocator<char> *)&tx);
        pUVar5 = UniValue::operator[](this_00,(string *)&txout);
        psVar6 = UniValue::get_str_abi_cxx11_(pUVar5);
        std::__cxx11::string::string((string *)local_58,psVar6);
        strFlags._M_dataplus._M_p._4_4_ = uVar12;
        strFlags._M_dataplus._M_p._0_4_ = uVar11;
        strFlags._M_string_length = (size_type)this_00;
        strFlags.field_2._M_allocated_capacity = (size_type)this_02;
        strFlags.field_2._8_4_ = in_stack_fffffffffffff710;
        strFlags.field_2._12_4_ = in_stack_fffffffffffff714;
        in_stack_fffffffffffff714 = ParseScriptFlags(strFlags);
        std::__cxx11::string::~string((string *)local_58);
        std::__cxx11::string::~string((string *)&txout);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&txout,"final",(allocator<char> *)&txcheck);
        bVar2 = UniValue::exists(this_00,(string *)&txout);
        if (bVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&tx,"final",(allocator<char> *)&local_780);
          pUVar5 = UniValue::operator[](this_00,(string *)&tx);
          bVar2 = UniValue::get_bool(pUVar5);
          std::__cxx11::string::~string((string *)&tx);
        }
        else {
          bVar2 = false;
        }
        std::__cxx11::string::~string((string *)&txout);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&txout,"success",(allocator<char> *)&tx);
        bVar3 = UniValue::exists(this_00,(string *)&txout);
        std::__cxx11::string::~string((string *)&txout);
        if (bVar3) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&tx,"success",(allocator<char> *)&local_780);
          pUVar5 = UniValue::operator[](this_00,(string *)&tx);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&txcheck,"scriptSig",(allocator<char> *)&local_760);
          pUVar5 = UniValue::operator[](pUVar5,(string *)&txcheck);
          psVar6 = UniValue::get_str_abi_cxx11_(pUVar5);
          ScriptFromHex((CScript *)&txout,psVar6);
          prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                    (&mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar7].scriptSig.super_CScriptBase,
                     (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&txout);
          prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&txout);
          std::__cxx11::string::~string((string *)&txcheck);
          std::__cxx11::string::~string((string *)&tx);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&txout,"success",(allocator<char> *)&local_780);
          pUVar5 = UniValue::operator[](this_00,(string *)&txout);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&tx,"witness",(allocator<char> *)&local_760);
          pUVar5 = UniValue::operator[](pUVar5,(string *)&tx);
          ScriptWitnessFromJSON((CScriptWitness *)&txcheck,pUVar5);
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::_M_move_assign(&mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar7].scriptWitness.stack,&txcheck);
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)&txcheck);
          std::__cxx11::string::~string((string *)&tx);
          std::__cxx11::string::~string((string *)&txout);
          CTransaction::CTransaction(&tx,&mtx);
          memset((PrecomputedTransactionData *)&txout,0,0x102);
          (this_02->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (this_02->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          *(undefined8 *)
           ((long)&(this_02->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                   super__Vector_impl_data._M_finish + 1) = 0;
          *(undefined8 *)
           ((long)&(this_02->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 1) = 0;
          std::vector<CTxOut,_std::allocator<CTxOut>_>::vector
                    ((vector<CTxOut,_std::allocator<CTxOut>_> *)&txcheck,&prevouts);
          PrecomputedTransactionData::Init<CTransaction>
                    ((PrecomputedTransactionData *)&txout,&tx,
                     (vector<CTxOut,_std::allocator<CTxOut>_> *)&txcheck,false);
          std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                    ((vector<CTxOut,_std::allocator<CTxOut>_> *)&txcheck);
          puVar1 = DAT_01160ed0;
          txcheck.super_TransactionSignatureChecker.m_mdb = ASSERT_FAIL;
          txcheck.super_TransactionSignatureChecker.amount =
               prevouts.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start[lVar7].nValue;
          txcheck.super_TransactionSignatureChecker.super_BaseSignatureChecker.
          _vptr_BaseSignatureChecker = (_func_int **)&PTR_CheckECDSASignature_01153240;
          txcheck.store = true;
          txcheck.m_signature_cache = &signature_cache;
          txcheck.super_TransactionSignatureChecker.txTo = &tx;
          txcheck.super_TransactionSignatureChecker.nIn = (uint)lVar7;
          txcheck.super_TransactionSignatureChecker.txdata = (PrecomputedTransactionData *)&txout;
          for (puVar8 = ALL_CONSENSUS_FLAGS; checker_00 = &txcheck, puVar8 != puVar1;
              puVar8 = puVar8 + 1) {
            if (((*puVar8 & ~in_stack_fffffffffffff714) == 0 | bVar2) == 1) {
              pvVar10 = (iterator)0x0;
              rVar4.super_class_property<bool>.value =
                   (class_property<bool>)
                   VerifyScript((CScript *)
                                (CONCAT71(tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                          _M_impl.super__Vector_impl_data._M_start._1_7_,
                                          tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                          _M_impl.super__Vector_impl_data._M_start._0_1_) +
                                 lVar7 * 0x68 + 0x28),
                                &prevouts.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                 _M_impl.super__Vector_impl_data._M_start[lVar7].scriptPubKey,
                                (CScriptWitness *)
                                (CONCAT71(tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                          _M_impl.super__Vector_impl_data._M_start._1_7_,
                                          tx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                          _M_impl.super__Vector_impl_data._M_start._0_1_) +
                                 lVar7 * 0x68 + 0x50),*puVar8,(BaseSignatureChecker *)checker_00,
                                (ScriptError *)0x0);
              local_738 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
              ;
              local_730 = "";
              local_748 = &boost::unit_test::basic_cstring<char_const>::null;
              local_740 = &boost::unit_test::basic_cstring<char_const>::null;
              file_07.m_end = (iterator)0x628;
              file_07.m_begin = (iterator)&local_738;
              msg_06.m_end = pvVar10;
              msg_06.m_begin = (iterator)checker_00;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,
                         (size_t)&local_748,msg_06);
              local_760.m_message.px = (element_type *)0x0;
              local_760.m_message.pn.pi_ = (sp_counted_base *)0x0;
              local_790 = "ret";
              local_788 = "";
              local_780.m_empty = false;
              local_780._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
              local_770 = boost::unit_test::lazy_ostream::inst;
              local_768 = &local_790;
              local_7a0 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
              ;
              local_798 = "";
              checker = (CachingTransactionSignatureChecker *)&DAT_00000001;
              pvVar10 = (iterator)0x0;
              local_760.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
              value = (readonly_property<bool>)
                      (readonly_property<bool>)rVar4.super_class_property<bool>.value;
              boost::test_tools::tt_detail::report_assertion
                        (&local_760,&local_780,1,0,WARN,(check_type)this_00,(size_t)&local_7a0,0x628
                        );
              boost::detail::shared_count::~shared_count(&local_760.m_message.pn);
            }
          }
          std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(this_02);
          CTransaction::~CTransaction(&tx);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&txout,"failure",(allocator<char> *)&tx);
        bVar2 = UniValue::exists(this_00,(string *)&txout);
        std::__cxx11::string::~string((string *)&txout);
        if (bVar2) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&tx,"failure",(allocator<char> *)&local_780);
          pUVar5 = UniValue::operator[](this_00,(string *)&tx);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&txcheck,"scriptSig",(allocator<char> *)&local_760);
          pUVar5 = UniValue::operator[](pUVar5,(string *)&txcheck);
          psVar6 = UniValue::get_str_abi_cxx11_(pUVar5);
          ScriptFromHex((CScript *)&txout,psVar6);
          prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                    (&mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar7].scriptSig.super_CScriptBase,
                     (prevector<28U,_unsigned_char,_unsigned_int,_int> *)&txout);
          prevector<28U,_unsigned_char,_unsigned_int,_int>::~prevector
                    ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)&txout);
          std::__cxx11::string::~string((string *)&txcheck);
          std::__cxx11::string::~string((string *)&tx);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&txout,"failure",(allocator<char> *)&local_780);
          pUVar5 = UniValue::operator[](this_00,(string *)&txout);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&tx,"witness",(allocator<char> *)&local_760);
          pUVar5 = UniValue::operator[](pUVar5,(string *)&tx);
          ScriptWitnessFromJSON((CScriptWitness *)&txcheck,pUVar5);
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::_M_move_assign(&mtx.vin.super__Vector_base<CTxIn,_std::allocator<CTxIn>_>._M_impl.
                            super__Vector_impl_data._M_start[lVar7].scriptWitness.stack,&txcheck);
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::~vector((vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                     *)&txcheck);
          std::__cxx11::string::~string((string *)&tx);
          std::__cxx11::string::~string((string *)&txout);
          CTransaction::CTransaction(&tx,&mtx);
          memset((PrecomputedTransactionData *)&txout,0,0x102);
          (this_02->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (this_02->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          *(undefined8 *)
           ((long)&(this_02->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                   super__Vector_impl_data._M_finish + 1) = 0;
          *(undefined8 *)
           ((long)&(this_02->super__Vector_base<CTxOut,_std::allocator<CTxOut>_>)._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 1) = 0;
          std::vector<CTxOut,_std::allocator<CTxOut>_>::vector
                    ((vector<CTxOut,_std::allocator<CTxOut>_> *)&txcheck,&prevouts);
          PrecomputedTransactionData::Init<CTransaction>
                    ((PrecomputedTransactionData *)&txout,&tx,
                     (vector<CTxOut,_std::allocator<CTxOut>_> *)&txcheck,false);
          std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector
                    ((vector<CTxOut,_std::allocator<CTxOut>_> *)&txcheck);
          puVar1 = DAT_01160ed0;
          txcheck.super_TransactionSignatureChecker.m_mdb = ASSERT_FAIL;
          txcheck.super_TransactionSignatureChecker.amount =
               prevouts.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>._M_impl.
               super__Vector_impl_data._M_start[lVar7].nValue;
          txcheck.super_TransactionSignatureChecker.super_BaseSignatureChecker.
          _vptr_BaseSignatureChecker = (_func_int **)&PTR_CheckECDSASignature_01153240;
          txcheck.store = true;
          txcheck.m_signature_cache = &signature_cache;
          txcheck.super_TransactionSignatureChecker.txTo = &tx;
          txcheck.super_TransactionSignatureChecker.nIn = (uint)lVar7;
          txcheck.super_TransactionSignatureChecker.txdata = (PrecomputedTransactionData *)&txout;
          for (puVar8 = ALL_CONSENSUS_FLAGS; checker = &txcheck, puVar8 != puVar1;
              puVar8 = puVar8 + 1) {
            if ((in_stack_fffffffffffff714 & ~*puVar8) == 0) {
              pvVar10 = (iterator)0x0;
              bVar2 = VerifyScript((CScript *)
                                   (CONCAT71(tx.vin.
                                             super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                             _M_impl.super__Vector_impl_data._M_start._1_7_,
                                             tx.vin.
                                             super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                             _M_impl.super__Vector_impl_data._M_start._0_1_) +
                                    lVar7 * 0x68 + 0x28),
                                   &prevouts.super__Vector_base<CTxOut,_std::allocator<CTxOut>_>.
                                    _M_impl.super__Vector_impl_data._M_start[lVar7].scriptPubKey,
                                   (CScriptWitness *)
                                   (CONCAT71(tx.vin.
                                             super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                             _M_impl.super__Vector_impl_data._M_start._1_7_,
                                             tx.vin.
                                             super__Vector_base<CTxIn,_std::allocator<CTxIn>_>.
                                             _M_impl.super__Vector_impl_data._M_start._0_1_) +
                                    lVar7 * 0x68 + 0x50),*puVar8,(BaseSignatureChecker *)checker,
                                   (ScriptError *)0x0);
              local_790 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
              ;
              local_788 = "";
              local_7b0 = &boost::unit_test::basic_cstring<char_const>::null;
              local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
              file_08.m_end = (iterator)0x639;
              file_08.m_begin = (iterator)&local_790;
              msg_07.m_end = pvVar10;
              msg_07.m_begin = (iterator)checker;
              boost::unit_test::unit_test_log_t::set_checkpoint
                        (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,
                         (size_t)&local_7b0,msg_07);
              local_760.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
              value = (readonly_property<bool>)!bVar2;
              local_760.m_message.px = (element_type *)0x0;
              local_760.m_message.pn.pi_ = (sp_counted_base *)0x0;
              local_7c0 = "!ret";
              local_7b8 = "";
              local_780.m_empty = false;
              local_780._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
              local_770 = boost::unit_test::lazy_ostream::inst;
              local_768 = &local_7c0;
              local_7d0 = 
              "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/script_tests.cpp"
              ;
              local_7c8 = "";
              pvVar10 = (iterator)0x0;
              boost::test_tools::tt_detail::report_assertion
                        (&local_760,&local_780,1,0,WARN,(check_type)this_00,(size_t)&local_7d0,0x639
                        );
              boost::detail::shared_count::~shared_count(&local_760.m_message.pn);
            }
          }
          std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(this_02);
          CTransaction::~CTransaction(&tx);
        }
        std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&prevouts);
        CMutableTransaction::~CMutableTransaction(&mtx);
        index_00 = index_00 + 1;
      }
      std::ifstream::close();
      UniValue::~UniValue(&tests);
      std::__cxx11::string::~string((string *)&data);
      std::ifstream::~ifstream(&file);
    }
    std::filesystem::__cxx11::path::~path(&path.super_path);
  }
  CuckooCache::cache<uint256,_SignatureCacheHasher>::~cache(&signature_cache.setValid);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(script_assets_test)
{
    // See src/test/fuzz/script_assets_test_minimizer.cpp for information on how to generate
    // the script_assets_test.json file used by this test.
    SignatureCache signature_cache{DEFAULT_SIGNATURE_CACHE_BYTES};

    const char* dir = std::getenv("DIR_UNIT_TEST_DATA");
    BOOST_WARN_MESSAGE(dir != nullptr, "Variable DIR_UNIT_TEST_DATA unset, skipping script_assets_test");
    if (dir == nullptr) return;
    auto path = fs::path(dir) / "script_assets_test.json";
    bool exists = fs::exists(path);
    BOOST_WARN_MESSAGE(exists, "File $DIR_UNIT_TEST_DATA/script_assets_test.json not found, skipping script_assets_test");
    if (!exists) return;
    std::ifstream file{path};
    BOOST_CHECK(file.is_open());
    file.seekg(0, std::ios::end);
    size_t length = file.tellg();
    file.seekg(0, std::ios::beg);
    std::string data(length, '\0');
    file.read(data.data(), data.size());
    UniValue tests = read_json(data);
    BOOST_CHECK(tests.isArray());
    BOOST_CHECK(tests.size() > 0);

    for (size_t i = 0; i < tests.size(); i++) {
        AssetTest(tests[i], signature_cache);
    }
    file.close();
}